

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  reference pdVar2;
  exception *e;
  iterator it;
  vector<double,_std::allocator<double>_> r;
  PolyFit<double> f;
  Options options;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff528;
  PolyFit<double> *in_stack_fffffffffffff530;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff540;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_ab0 [5];
  Options *in_stack_fffffffffffff578;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff580;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff588;
  PolyFit<double> *in_stack_fffffffffffff590;
  PolyFit<double> *in_stack_fffffffffffff640;
  PolyFit<double> *in_stack_fffffffffffff648;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff7b8;
  char *in_stack_fffffffffffff7c0;
  Options local_68 [4];
  undefined4 local_4;
  
  local_4 = 0;
  logging::setLevel(&logger,ERROR);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x246564);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x246571);
  IO::readData<double>(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  IO::readData<double>(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  PolyFit<double>::Options::Options(local_68);
  local_68[0].polyDeg = 3;
  local_68[0].solver = EIGEN_JACOBI_SVD;
  local_68[0].maxMPts = 10;
  local_68[0].maxTrial = 500;
  local_68[0].tolerance = 0.001;
  PolyFit<double>::PolyFit
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,in_stack_fffffffffffff580,
             in_stack_fffffffffffff578);
  PolyFit<double>::solveRLS(in_stack_fffffffffffff640);
  PolyFit<double>::evalPoly
            (in_stack_fffffffffffff648,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff640);
  local_ab0[0]._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff528);
  while( true ) {
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffff528);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffff530,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffff528);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_ab0);
    in_stack_fffffffffffff530 = (PolyFit<double> *)std::ostream::operator<<(&std::cout,*pdVar2);
    std::ostream::operator<<(in_stack_fffffffffffff530,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_ab0);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff540);
  PolyFit<double>::~PolyFit(in_stack_fffffffffffff530);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff540);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff540);
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
  // Sets the log level to DEBUG
  logger.setLevel(ERROR);

  try 
  {
    // Create (sample, signal) vectors
    std::vector<double> x,y;

    // Read in (sample, signal) = (x,y) values
    IO::readData<double>(argv[1],x);
    IO::readData<double>(argv[2],y);

    // Create options for fitting
    PolyFit<double>::Options options;

    options.polyDeg = 3; // 3-rd degree polynomial
    options.solver = PolyFit<double>::EIGEN_JACOBI_SVD; // SVD solver
    options.maxMPts = 10; // #Pts to use for fitting
    options.maxTrial = 500; // Max. nr. of trials
    options.tolerance = 0.001; // Distance tolerance for inlier

    // Create fitting object
    PolyFit<double>f(x,y,options);

    // Solve using RANSAC 
    f.solveRLS();

    // Output result
    //cout << f << endl;
    
    std::vector<double> r = f.evalPoly(x);
    std::vector<double>::iterator it = r.begin();
    while (it != r.end())
    {
      std::cout << *it << std::endl;
      ++it;
    }
  



  }
  catch (exception &e)
  {
    logger.log(ERROR, "[%s]: Exiting ...\n",
        __func__);
    exit(EXIT_FAILURE);
  }
  return 0;

}